

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.hpp
# Opt level: O1

void __thiscall
Triangle::Triangle(Triangle *this,vec3f v1,vec3f v2,vec3f v3,vec2f vt1,vec2f vt2,vec2f vt3,vec3f vn1
                  ,vec3f vn2,vec3f vn3)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float (*pafVar5) [3];
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  float *pfVar10;
  ulong uVar11;
  float *pfVar12;
  float *pfVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  mat3f res;
  float local_80 [10];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  float local_38;
  
  fVar24 = v1.z;
  (this->super_BasicPrimitive).super_Primitive._vptr_Primitive =
       (_func_int **)&PTR_intersect_0016c018;
  (this->v1).x = (float)(int)v1._0_8_;
  (this->v1).y = (float)(int)((ulong)v1._0_8_ >> 0x20);
  (this->v1).z = fVar24;
  (this->v2).x = (float)(int)v2._0_8_;
  (this->v2).y = (float)(int)((ulong)v2._0_8_ >> 0x20);
  (this->v2).z = v2.z;
  (this->v3).x = (float)(int)v3._0_8_;
  (this->v3).y = (float)(int)((ulong)v3._0_8_ >> 0x20);
  (this->v3).z = v3.z;
  (this->vn1).z = vn1.z;
  (this->vn1).x = (float)(int)vn1._0_8_;
  (this->vn1).y = (float)(int)((ulong)vn1._0_8_ >> 0x20);
  (this->vn2).x = vn2.x;
  (this->vn2).y = vn2.y;
  (this->vn2).z = vn2.z;
  (this->vn3).x = vn3.x;
  (this->vn3).y = vn3.y;
  (this->vn3).z = vn3.z;
  auVar4._8_4_ = vt2.x;
  auVar4._0_8_ = vt1;
  auVar4._12_4_ = vt2.y;
  this->vt1 = vt1;
  (this->vt2).x = (float)(int)auVar4._8_8_;
  (this->vt2).y = (float)(int)((ulong)auVar4._8_8_ >> 0x20);
  this->vt3 = vt3;
  fVar18 = v2.x - v1.x;
  fVar20 = v2.z - fVar24;
  fVar25 = v3.x - v1.x;
  fVar22 = v2.y - v1.y;
  fVar23 = v3.y - v1.y;
  fVar24 = v3.z - fVar24;
  fVar26 = fVar22 * fVar24 - fVar23 * fVar20;
  fVar21 = fVar20 * fVar25 - fVar24 * fVar18;
  fVar19 = fVar18 * fVar23 - fVar25 * fVar22;
  fVar17 = fVar19 * fVar19 + fVar26 * fVar26 + fVar21 * fVar21;
  *(float *)((long)((this->tMatrix).data + 0) + 0) = 0.0;
  *(float *)((long)((this->tMatrix).data + 0) + 4) = 0.0;
  *(undefined8 *)((this->tMatrix).data[0] + 2) = 0;
  pafVar5 = (this->tMatrix).data;
  *(float *)((long)(pafVar5 + 1) + 4) = 0.0;
  *(float *)((long)(pafVar5 + 1) + 8) = 0.0;
  *(float *)((long)((this->tMatrix).data + 2) + 0) = 0.0;
  *(float *)((long)((this->tMatrix).data + 2) + 4) = 0.0;
  *(undefined8 *)((this->tMatrix).data[2] + 2) = 0;
  (this->planeNormal).y = 0.0;
  (this->planeNormal).z = 0.0;
  if (fVar17 < 0.0) {
    fVar17 = sqrtf(fVar17);
  }
  else {
    fVar17 = SQRT(fVar17);
  }
  fVar17 = 1.0 / fVar17;
  fVar26 = fVar26 * fVar17;
  fVar21 = fVar21 * fVar17;
  fVar19 = fVar19 * fVar17;
  (this->planeNormal).x = fVar26;
  (this->planeNormal).y = fVar21;
  (this->planeNormal).z = fVar19;
  if (vn1.z * fVar19 + fVar26 * vn1.x + fVar21 * vn1.y < 0.0) {
    uVar7 = CONCAT44(fVar21,fVar26) ^ 0x8000000080000000;
    (this->planeNormal).x = (float)(int)uVar7;
    (this->planeNormal).y = (float)(int)(uVar7 >> 0x20);
    (this->planeNormal).z = -fVar19;
  }
  fVar19 = fVar23 * fVar20 - fVar22 * fVar24;
  fVar21 = fVar24 * fVar18 - fVar20 * fVar25;
  fVar17 = fVar25 * fVar22 - fVar18 * fVar23;
  fVar17 = fVar17 * fVar17 + fVar19 * fVar19 + fVar21 * fVar21;
  if (fVar17 < 0.0) {
    fVar17 = sqrtf(fVar17);
  }
  else {
    fVar17 = SQRT(fVar17);
  }
  this->one_by_2S = 1.0 / fVar17;
  fVar17 = fVar24 * fVar24 + fVar25 * fVar25 + fVar23 * fVar23;
  if (fVar17 < 0.0) {
    fVar17 = sqrtf(fVar17);
  }
  else {
    fVar17 = SQRT(fVar17);
  }
  fVar17 = 1.0 / fVar17;
  local_80[2] = fVar22 * fVar17 * fVar24 + -fVar20 * fVar23 * fVar17;
  local_80[5] = fVar20 * fVar25 * fVar17 + fVar17 * fVar24 * -fVar18;
  local_80[8] = fVar23 * fVar17 * fVar18 + fVar25 * fVar17 * -fVar22;
  local_80[0] = fVar18;
  local_80[1] = fVar25;
  local_80[3] = fVar22;
  local_80[4] = fVar23;
  local_80[6] = fVar20;
  local_80[7] = fVar24;
  pfVar10 = local_80 + 8;
  pfVar12 = (float *)&local_58;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0.0;
  uVar7 = 2;
  lVar15 = 0;
  do {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar7;
    lVar16 = lVar15 + 1;
    lVar8 = lVar16;
    if (lVar16 == 3) {
      lVar8 = 0;
    }
    uVar11 = 2;
    pfVar13 = pfVar12;
    lVar14 = 0;
    do {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar11;
      uVar9 = SUB168(auVar3 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 & 0xfffffffffffffffc;
      lVar1 = lVar14 + 1;
      lVar6 = 0;
      if (lVar14 != 2) {
        lVar6 = lVar1;
      }
      *pfVar13 = (local_80[lVar8 * 3 + lVar6] *
                  *(float *)((long)pfVar10 +
                            lVar14 * 4 +
                            uVar9 * -3 +
                            (SUB168(auVar2 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 &
                            0xfffffffffffffffcU) * -9) -
                 *(float *)((long)local_80 + lVar14 * 4 + uVar9 * -3 + lVar8 * 0xc + 8) *
                 local_80[(ulong)(((int)lVar15 + 2U) % 3) * 3 + lVar6]) *
                 (1.0 / ((-fVar25 * fVar22 * local_80[8] +
                         local_80[5] * -fVar18 * fVar24 +
                         fVar22 * local_80[2] * fVar24 +
                         fVar18 * fVar23 * local_80[8] + fVar25 * local_80[5] * fVar20) -
                        local_80[2] * fVar23 * fVar20));
      pfVar13 = pfVar13 + 3;
      uVar11 = uVar11 + 1;
      lVar14 = lVar1;
    } while (lVar1 != 3);
    pfVar12 = pfVar12 + 1;
    pfVar10 = pfVar10 + 3;
    uVar7 = uVar7 + 1;
    lVar15 = lVar16;
  } while (lVar16 != 3);
  (this->tMatrix).data[2][2] = local_38;
  *(undefined8 *)((this->tMatrix).data[1] + 1) = local_48;
  *(undefined8 *)(this->tMatrix).data[2] = uStack_40;
  *(undefined8 *)(this->tMatrix).data[0] = local_58;
  *(undefined8 *)((this->tMatrix).data[0] + 2) = uStack_50;
  return;
}

Assistant:

Triangle(vec3f v1, vec3f v2, vec3f v3, vec2f vt1, vec2f vt2, vec2f vt3, vec3f vn1, vec3f vn2, vec3f vn3):
		v1(v1), v2(v2), v3(v3), vn1(vn1), vn2(vn2), vn3(vn3), vt1(vt1), vt2(vt2), vt3(vt3)
	// pre-calculation to accelerate intersection / interpolation computation
	{
		// NOTE: be careful when dealing with tiny triangles!
		assert(norm(v1-v2)>0);
		assert(norm(v1-v3)>0);
		assert(norm(v2-v3)>0);
		assert(norm(cross(normalized(v2-v1), normalized(v3-v1))) > 1e-9);

		planeNormal = normalized(cross(v2-v1, v3-v1));
		// make sure plane normal points outward
		if (dot(planeNormal, vn1) < 0)
			planeNormal *= -1;
		one_by_2S = 1 / norm(cross(v3-v1, v2-v1));
		tMatrix = inverse(mat3f(v2-v1, v3-v1, cross(v2-v1, normalized(v3-v1))));
	}